

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_4::PtexUtils::reduce
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  void *pvVar1;
  uint16_t uVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  long lVar9;
  
  switch(dt) {
  case dt_uint8:
    if (vw * sstride != 0) {
      pvVar3 = (void *)((long)(vw * sstride) + (long)src);
      iVar6 = uw * nchan;
      lVar5 = (long)nchan;
      do {
        pvVar8 = src;
        if (iVar6 != 0) {
          pvVar8 = (void *)((long)src + (long)iVar6);
          do {
            if (nchan != 0) {
              lVar9 = 0;
              do {
                *(char *)((long)dst + lVar9) =
                     (char)((uint)*(byte *)((long)src + lVar9 + (sstride + nchan)) +
                            (uint)*(byte *)((long)src + lVar9 + sstride) +
                            (uint)*(byte *)((long)src + lVar5 + lVar9) +
                            (uint)*(byte *)((long)src + lVar9) >> 2);
                lVar9 = lVar9 + 1;
              } while (lVar9 != lVar5);
              dst = (void *)((long)dst + lVar9);
              src = (void *)((long)src + lVar5);
            }
            src = (void *)((long)src + lVar5);
          } while (src != pvVar8);
        }
        dst = (void *)((long)dst + (long)(dstride - iVar6 / 2));
        src = (void *)((long)pvVar8 + (long)(sstride * 2 - iVar6));
      } while (src != pvVar3);
    }
    break;
  case dt_uint16:
    iVar6 = sstride / 2;
    if (vw * iVar6 != 0) {
      pvVar3 = (void *)((long)src + (long)(vw * iVar6) * 2);
      iVar7 = uw * nchan;
      lVar5 = (long)nchan;
      do {
        pvVar8 = src;
        if (iVar7 != 0) {
          pvVar8 = (void *)((long)src + (long)iVar7 * 2);
          do {
            if (nchan != 0) {
              pvVar1 = (void *)((long)src + lVar5 * 2);
              lVar9 = 0;
              do {
                *(short *)((long)dst + lVar9) =
                     (short)((uint)*(ushort *)((long)src + lVar9 + (long)(iVar6 + nchan) * 2) +
                             (uint)*(ushort *)((long)src + lVar9 + (long)iVar6 * 2) +
                             (uint)*(ushort *)((long)pvVar1 + lVar9) +
                             (uint)*(ushort *)((long)src + lVar9) >> 2);
                lVar9 = lVar9 + 2;
              } while (lVar9 != lVar5 * 2);
              dst = (void *)((long)dst + lVar9);
              src = pvVar1;
            }
            src = (void *)((long)src + lVar5 * 2);
          } while (src != pvVar8);
        }
        src = (void *)((long)pvVar8 + (long)(iVar6 * 2 - iVar7) * 2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar7 / 2) * 2);
      } while (src != pvVar3);
    }
    break;
  case dt_half:
    iVar6 = sstride / 2;
    if (vw * iVar6 != 0) {
      pvVar3 = (void *)((long)src + (long)(vw * iVar6) * 2);
      iVar7 = uw * nchan;
      lVar5 = (long)nchan;
      do {
        pvVar8 = src;
        if (iVar7 != 0) {
          pvVar8 = (void *)((long)src + (long)iVar7 * 2);
          do {
            if (nchan != 0) {
              pvVar1 = (void *)((long)src + lVar5 * 2);
              lVar9 = 0;
              do {
                uVar2 = PtexHalf::fromFloat((*(float *)(PtexHalf::h2fTable +
                                                       (ulong)*(ushort *)((long)src + lVar9) * 4) +
                                             *(float *)(PtexHalf::h2fTable +
                                                       (ulong)*(ushort *)((long)pvVar1 + lVar9) * 4)
                                             + *(float *)(PtexHalf::h2fTable +
                                                         (ulong)*(ushort *)
                                                                 ((long)src +
                                                                 lVar9 + (long)iVar6 * 2) * 4) +
                                            *(float *)(PtexHalf::h2fTable +
                                                      (ulong)*(ushort *)
                                                              ((long)src +
                                                              lVar9 + (long)(iVar6 + nchan) * 2) * 4
                                                      )) * 0.25);
                *(uint16_t *)((long)dst + lVar9) = uVar2;
                lVar9 = lVar9 + 2;
              } while (lVar9 != lVar5 * 2);
              dst = (void *)((long)dst + lVar9);
              src = pvVar1;
            }
            src = (void *)((long)src + lVar5 * 2);
          } while (src != pvVar8);
        }
        src = (void *)((long)pvVar8 + (long)(iVar6 * 2 - iVar7) * 2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar7 / 2) * 2);
      } while (src != pvVar3);
    }
    break;
  case dt_float:
    iVar6 = sstride + 3;
    if (-1 < sstride) {
      iVar6 = sstride;
    }
    iVar6 = iVar6 >> 2;
    if (vw * iVar6 != 0) {
      pvVar3 = (void *)((long)src + (long)(vw * iVar6) * 4);
      iVar4 = uw * nchan;
      iVar7 = dstride + 3;
      if (-1 < dstride) {
        iVar7 = dstride;
      }
      lVar5 = (long)nchan;
      do {
        pvVar8 = src;
        if (iVar4 != 0) {
          pvVar8 = (void *)((long)src + (long)iVar4 * 4);
          do {
            if (nchan != 0) {
              pvVar1 = (void *)((long)src + lVar5 * 4);
              lVar9 = 0;
              do {
                *(float *)((long)dst + lVar9) =
                     (*(float *)((long)src + lVar9) + *(float *)((long)pvVar1 + lVar9) +
                      *(float *)((long)src + lVar9 + (long)iVar6 * 4) +
                     *(float *)((long)src + lVar9 + (long)(iVar6 + nchan) * 4)) * 0.25;
                lVar9 = lVar9 + 4;
              } while (lVar9 != lVar5 * 4);
              dst = (void *)((long)dst + lVar9);
              src = pvVar1;
            }
            src = (void *)((long)src + lVar5 * 4);
          } while (src != pvVar8);
        }
        src = (void *)((long)pvVar8 + (long)(iVar6 * 2 - iVar4) * 4);
        dst = (void *)((long)dst + (long)((iVar7 >> 2) - iVar4 / 2) * 4);
      } while (src != pvVar3);
    }
  }
  return;
}

Assistant:

void reduce(const void* src, int sstride, int uw, int vw,
            void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reduce(static_cast<const uint8_t*>(src), sstride, uw, vw,
                              static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reduce(static_cast<const PtexHalf*>(src), sstride, uw, vw,
                              static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reduce(static_cast<const uint16_t*>(src), sstride, uw, vw,
                              static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reduce(static_cast<const float*>(src), sstride, uw, vw,
                              static_cast<float*>(dst), dstride, nchan); break;
    }
}